

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  MainLoop *this;
  MainLoop *local_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  _func_bool *local_10;
  
  MainLoop::Init();
  local_10 = main::anon_class_1_0_00000001::__invoke;
  std::function<bool()>::operator=((function<bool()> *)&onContinueCheck,&local_10);
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
  }
  this = (MainLoop *)&local_20;
  MainLoop::Init();
  MainLoop::AddToDelayedUpdate(this,main::anon_class_1_0_00000001::__invoke);
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
  }
  MainLoop::Init();
  MainLoop::Run(local_20);
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
  }
  return 0;
}

Assistant:

int main()
{
  static bool keepRunning = true;
  MainLoop::Get()->SetRunCondition([]() -> bool { return keepRunning; });
  MainLoop::Get()->AddToDelayedUpdate([]() {
    static int count = 0;
    count++;
    if (count > 10)
      keepRunning = false;
    std::cout << "update!\n"; 
    });
  MainLoop::Get()->Run();
  return 0;
}